

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall pbrt::syntactic::Attributes::Attributes(Attributes *this,SP *_parent)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
  ::vector(&this->areaLightSources,
           &((_parent->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->areaLightSources);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(&this->mediumInterface,
         &((_parent->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->mediumInterface);
  peVar2 = (_parent->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this->reverseOrientation = peVar2->reverseOrientation;
  (this->parent).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  p_Var3 = (_parent->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->parent).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  p_Var1 = &(this->namedMaterial)._M_t._M_impl.super__Rb_tree_header;
  (this->namedMaterial)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namedMaterial)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->namedMaterial)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->namedMaterial)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->namedMaterial)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->namedMedium)._M_t._M_impl.super__Rb_tree_header;
  (this->namedMedium)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namedMedium)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->namedMedium)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->namedMedium)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->namedMedium)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->namedTexture)._M_t._M_impl.super__Rb_tree_header;
  (this->namedTexture)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->namedTexture)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->namedTexture)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->namedTexture)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->namedTexture)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Attributes(Attributes::SP _parent)
        : parent(_parent),
          areaLightSources(_parent->areaLightSources),
          mediumInterface(_parent->mediumInterface),
          reverseOrientation(_parent->reverseOrientation)
      {}